

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iterator_enc.c
# Opt level: O0

void VP8IteratorNzToBytes(VP8EncIterator *it)

{
  uint uVar1;
  uint uVar2;
  int *left_nz;
  int *top_nz;
  int lnz;
  int tnz;
  VP8EncIterator *it_local;
  
  uVar1 = *it->nz_;
  uVar2 = it->nz_[-1];
  it->top_nz_[0] = (uint)((uVar1 & 0x1000) != 0);
  it->top_nz_[1] = (uint)((uVar1 & 0x2000) != 0);
  it->top_nz_[2] = (uint)((uVar1 & 0x4000) != 0);
  it->top_nz_[3] = (uint)((uVar1 & 0x8000) != 0);
  it->top_nz_[4] = (uint)((uVar1 & 0x40000) != 0);
  it->top_nz_[5] = (uint)((uVar1 & 0x80000) != 0);
  it->top_nz_[6] = (uint)((uVar1 & 0x400000) != 0);
  it->top_nz_[7] = (uint)((uVar1 & 0x800000) != 0);
  it->top_nz_[8] = (uint)((uVar1 & 0x1000000) != 0);
  it->left_nz_[0] = (uint)((uVar2 & 8) != 0);
  it->left_nz_[1] = (uint)((uVar2 & 0x80) != 0);
  it->left_nz_[2] = (uint)((uVar2 & 0x800) != 0);
  it->left_nz_[3] = (uint)((uVar2 & 0x8000) != 0);
  it->left_nz_[4] = (uint)((uVar2 & 0x20000) != 0);
  it->left_nz_[5] = (uint)((uVar2 & 0x80000) != 0);
  it->left_nz_[6] = (uint)((uVar2 & 0x200000) != 0);
  it->left_nz_[7] = (uint)((uVar2 & 0x800000) != 0);
  return;
}

Assistant:

void VP8IteratorNzToBytes(VP8EncIterator* const it) {
  const int tnz = it->nz_[0], lnz = it->nz_[-1];
  int* const top_nz = it->top_nz_;
  int* const left_nz = it->left_nz_;

  // Top-Y
  top_nz[0] = BIT(tnz, 12);
  top_nz[1] = BIT(tnz, 13);
  top_nz[2] = BIT(tnz, 14);
  top_nz[3] = BIT(tnz, 15);
  // Top-U
  top_nz[4] = BIT(tnz, 18);
  top_nz[5] = BIT(tnz, 19);
  // Top-V
  top_nz[6] = BIT(tnz, 22);
  top_nz[7] = BIT(tnz, 23);
  // DC
  top_nz[8] = BIT(tnz, 24);

  // left-Y
  left_nz[0] = BIT(lnz,  3);
  left_nz[1] = BIT(lnz,  7);
  left_nz[2] = BIT(lnz, 11);
  left_nz[3] = BIT(lnz, 15);
  // left-U
  left_nz[4] = BIT(lnz, 17);
  left_nz[5] = BIT(lnz, 19);
  // left-V
  left_nz[6] = BIT(lnz, 21);
  left_nz[7] = BIT(lnz, 23);
  // left-DC is special, iterated separately
}